

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O3

void __thiscall SQCompiler::ClassExp(SQCompiler *this)

{
  undefined2 uVar1;
  ushort uVar2;
  SQInstruction in_RAX;
  long lVar3;
  SQInteger SVar4;
  SQInteger SVar5;
  SQFuncState *pSVar6;
  SQInteger SVar7;
  SQInstruction local_28;
  
  lVar3 = this->_token;
  SVar7 = -1;
  local_28 = in_RAX;
  if (lVar3 == 0x134) {
    SVar7 = SQLexer::Lex(&this->_lex);
    this->_token = SVar7;
    Expression(this);
    SVar7 = SQFuncState::TopTarget(this->_fs);
    lVar3 = this->_token;
  }
  if (lVar3 == 0x140) {
    SVar4 = SQLexer::Lex(&this->_lex);
    this->_token = SVar4;
    pSVar6 = this->_fs;
    SVar4 = SQFuncState::PushTarget(pSVar6,-1);
    local_28._arg0 = (uchar)SVar4;
    local_28._0_5_ = 0x2100000000;
    local_28 = (SQInstruction)((ulong)local_28._4_2_ << 0x20);
    SQFuncState::AddInstruction(pSVar6,&local_28);
    ParseTableOrClass(this,0x2c,0x141);
    SVar4 = SQFuncState::TopTarget(this->_fs);
    Expect(this,0x7b);
    if (SVar4 != -1) {
      SQFuncState::PopTarget(this->_fs);
      goto LAB_00113431;
    }
  }
  else {
    Expect(this,0x7b);
  }
  SVar4 = 0xff;
LAB_00113431:
  pSVar6 = this->_fs;
  if (SVar7 == -1) {
    SVar7 = SQFuncState::PushTarget(pSVar6,-1);
    local_28._arg0 = (uchar)SVar7;
    local_28._0_5_ = 0x2100000000;
    uVar2 = local_28._4_2_;
    local_28._arg2 = '\0';
    local_28._arg3 = '\0';
    local_28.op = (char)uVar2;
    local_28._arg0 = (char)(uVar2 >> 8);
    local_28._arg1 = -1;
  }
  else {
    SQFuncState::PopTarget(pSVar6);
    pSVar6 = this->_fs;
    SVar5 = SQFuncState::PushTarget(pSVar6,-1);
    local_28._arg0 = (uchar)SVar5;
    local_28._0_5_ = 0x2100000000;
    uVar1 = local_28._4_2_;
    local_28.op = (char)uVar1;
    local_28._arg0 = (char)((ushort)uVar1 >> 8);
    local_28._arg1 = (int)SVar7;
    local_28._arg2 = '\0';
    local_28._arg3 = '\0';
  }
  local_28._arg2 = (uchar)SVar4;
  local_28._arg3 = '\x02';
  SQFuncState::AddInstruction(pSVar6,&local_28);
  ParseTableOrClass(this,0x3b,0x7d);
  return;
}

Assistant:

void ClassExp()
    {
        SQInteger base = -1;
        SQInteger attrs = -1;
        if(_token == TK_EXTENDS) {
            Lex(); Expression();
            base = _fs->TopTarget();
        }
        if(_token == TK_ATTR_OPEN) {
            Lex();
            _fs->AddInstruction(_OP_NEWOBJ, _fs->PushTarget(),0,NOT_TABLE);
            ParseTableOrClass(_SC(','),TK_ATTR_CLOSE);
            attrs = _fs->TopTarget();
        }
        Expect(_SC('{'));
        if(attrs != -1) _fs->PopTarget();
        if(base != -1) _fs->PopTarget();
        _fs->AddInstruction(_OP_NEWOBJ, _fs->PushTarget(), base, attrs,NOT_CLASS);
        ParseTableOrClass(_SC(';'),_SC('}'));
    }